

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

uint8 get_marker(jpeg *j)

{
  uint8 uVar1;
  int iVar2;
  
  uVar1 = j->marker;
  if (uVar1 == 0xff) {
    iVar2 = get8(&j->s);
    uVar1 = 0xff;
    if ((char)iVar2 == -1) {
      iVar2 = 0xff;
      while (uVar1 = (uint8)iVar2, uVar1 == 0xff) {
        iVar2 = get8(&j->s);
      }
    }
  }
  else {
    j->marker = 0xff;
  }
  return uVar1;
}

Assistant:

static uint8 get_marker(jpeg *j)
{
   uint8 x;
   if (j->marker != MARKER_none) { x = j->marker; j->marker = MARKER_none; return x; }
   x = get8u(&j->s);
   if (x != 0xff) return MARKER_none;
   while (x == 0xff)
      x = get8u(&j->s);
   return x;
}